

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ClearMetadata(VP8LMetadata *hdr)

{
  WebPSafeFree((void *)0x146a12);
  VP8LHuffmanTablesDeallocate((HuffmanTables *)hdr);
  VP8LHtreeGroupsFree((HTreeGroup *)0x146a2c);
  VP8LColorCacheClear((VP8LColorCache *)0x146a39);
  VP8LColorCacheClear((VP8LColorCache *)0x146a46);
  InitMetadata((VP8LMetadata *)0x146a4f);
  return;
}

Assistant:

static void ClearMetadata(VP8LMetadata* const hdr) {
  assert(hdr != NULL);

  WebPSafeFree(hdr->huffman_image_);
  VP8LHuffmanTablesDeallocate(&hdr->huffman_tables_);
  VP8LHtreeGroupsFree(hdr->htree_groups_);
  VP8LColorCacheClear(&hdr->color_cache_);
  VP8LColorCacheClear(&hdr->saved_color_cache_);
  InitMetadata(hdr);
}